

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

xmlLocationSetPtr xmlXPtrLocationSetCreate(xmlXPathObjectPtr val)

{
  int iVar1;
  xmlLocationSetPtr pxVar2;
  xmlXPathObjectPtr *ppxVar3;
  
  pxVar2 = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
  if (pxVar2 == (xmlLocationSetPtr)0x0) {
    xmlXPtrErrMemory("allocating locationset");
  }
  else {
    pxVar2->locNr = 0;
    pxVar2->locMax = 0;
    pxVar2->locTab = (xmlXPathObjectPtr *)0x0;
    if (val == (xmlXPathObjectPtr)0x0) {
      return pxVar2;
    }
    ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    pxVar2->locTab = ppxVar3;
    if (ppxVar3 != (xmlXPathObjectPtr *)0x0) {
      ppxVar3[8] = (xmlXPathObjectPtr)0x0;
      ppxVar3[9] = (xmlXPathObjectPtr)0x0;
      ppxVar3[6] = (xmlXPathObjectPtr)0x0;
      ppxVar3[7] = (xmlXPathObjectPtr)0x0;
      ppxVar3[4] = (xmlXPathObjectPtr)0x0;
      ppxVar3[5] = (xmlXPathObjectPtr)0x0;
      ppxVar3[2] = (xmlXPathObjectPtr)0x0;
      ppxVar3[3] = (xmlXPathObjectPtr)0x0;
      *ppxVar3 = (xmlXPathObjectPtr)0x0;
      ppxVar3[1] = (xmlXPathObjectPtr)0x0;
      pxVar2->locMax = 10;
      iVar1 = pxVar2->locNr;
      pxVar2->locNr = iVar1 + 1;
      pxVar2->locTab[iVar1] = val;
      return pxVar2;
    }
    xmlXPtrErrMemory("allocating locationset");
    (*xmlFree)(pxVar2);
  }
  return (xmlLocationSetPtr)0x0;
}

Assistant:

xmlLocationSetPtr
xmlXPtrLocationSetCreate(xmlXPathObjectPtr val) {
    xmlLocationSetPtr ret;

    ret = (xmlLocationSetPtr) xmlMalloc(sizeof(xmlLocationSet));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating locationset");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlLocationSet));
    if (val != NULL) {
        ret->locTab = (xmlXPathObjectPtr *) xmlMalloc(XML_RANGESET_DEFAULT *
					     sizeof(xmlXPathObjectPtr));
	if (ret->locTab == NULL) {
	    xmlXPtrErrMemory("allocating locationset");
	    xmlFree(ret);
	    return(NULL);
	}
	memset(ret->locTab, 0 ,
	       XML_RANGESET_DEFAULT * (size_t) sizeof(xmlXPathObjectPtr));
        ret->locMax = XML_RANGESET_DEFAULT;
	ret->locTab[ret->locNr++] = val;
    }
    return(ret);
}